

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Journal.h
# Opt level: O0

void __thiscall
beast::Journal::ScopedStream::ScopedStream<char[27]>
          (ScopedStream *this,Stream *stream,char (*t) [27])

{
  Severity level;
  Sink *sink;
  char (*t_local) [27];
  Stream *stream_local;
  ScopedStream *this_local;
  
  sink = Stream::sink(stream);
  level = Stream::level(stream);
  ScopedStream(this,sink,level);
  std::operator<<((ostream *)&this->m_ostream,*t);
  return;
}

Assistant:

Journal::ScopedStream::ScopedStream (Journal::Stream const& stream, T const& t)
   : ScopedStream (stream.sink(), stream.level())
{
    m_ostream << t;
}